

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_linalg.c
# Opt level: O1

double nrminf(cupdlp_int n,double *x,cupdlp_int incx)

{
  ulong uVar1;
  double dVar2;
  double dVar3;
  
  if (0 < n) {
    uVar1 = 0;
    dVar3 = 0.0;
    do {
      dVar2 = ABS(x[uVar1]);
      if (ABS(x[uVar1]) <= dVar3) {
        dVar2 = dVar3;
      }
      uVar1 = uVar1 + 1;
      dVar3 = dVar2;
    } while ((uint)n != uVar1);
    return dVar2;
  }
  return 0.0;
}

Assistant:

double nrminf(cupdlp_int n, const double *x, cupdlp_int incx) {
#ifdef USE_MY_BLAS
  assert(incx == 1);

  double nrm = 0.0;

  for (int i = 0; i < n; ++i) {
    double tmp = fabs(x[i]);
    if (tmp > nrm) nrm = tmp;
  }

  return nrm;
#else
  return dnrm2(n, x, incx);
#endif
}